

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

xmlHashTablePtr
xmlHashCopySafe(xmlHashTablePtr hash,xmlHashCopier copyFunc,xmlHashDeallocator deallocFunc)

{
  int iVar1;
  xmlHashTablePtr hash_00;
  void *payload;
  xmlHashEntry *pxVar2;
  xmlHashEntry *pxVar3;
  
  if ((copyFunc == (xmlHashCopier)0x0 || hash == (xmlHashTablePtr)0x0) ||
     (hash_00 = xmlHashCreate(hash->size), hash_00 == (xmlHashTablePtr)0x0)) {
LAB_00131f31:
    hash_00 = (xmlHashTablePtr)0x0;
  }
  else if ((ulong)hash->size != 0) {
    pxVar3 = hash->table;
    pxVar2 = pxVar3 + hash->size;
    do {
      if (pxVar3->hashValue != 0) {
        payload = (*copyFunc)(pxVar3->payload,pxVar3->key);
        if (payload != (void *)0x0) {
          iVar1 = xmlHashUpdateInternal
                            (hash_00,pxVar3->key,pxVar3->key2,pxVar3->key3,payload,
                             (xmlHashDeallocator)0x0,0);
          if (0 < iVar1) goto LAB_00131f0c;
          if (deallocFunc != (xmlHashDeallocator)0x0) {
            (*deallocFunc)(payload,pxVar3->key);
          }
        }
        xmlHashFree(hash_00,deallocFunc);
        goto LAB_00131f31;
      }
LAB_00131f0c:
      pxVar3 = pxVar3 + 1;
    } while (pxVar3 < pxVar2);
  }
  return hash_00;
}

Assistant:

xmlHashTablePtr
xmlHashCopySafe(xmlHashTablePtr hash, xmlHashCopier copyFunc,
                xmlHashDeallocator deallocFunc) {
    const xmlHashEntry *entry, *end;
    xmlHashTablePtr ret;

    if ((hash == NULL) || (copyFunc == NULL))
        return(NULL);

    ret = xmlHashCreate(hash->size);
    if (ret == NULL)
        return(NULL);

    if (hash->size == 0)
        return(ret);

    end = &hash->table[hash->size];

    for (entry = hash->table; entry < end; entry++) {
        if (entry->hashValue != 0) {
            void *copy;

            copy = copyFunc(entry->payload, entry->key);
            if (copy == NULL)
                goto error;
            if (xmlHashAdd3(ret, entry->key, entry->key2, entry->key3,
                            copy) <= 0) {
                if (deallocFunc != NULL)
                    deallocFunc(copy, entry->key);
                goto error;
            }
        }
    }

    return(ret);

error:
    xmlHashFree(ret, deallocFunc);
    return(NULL);
}